

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

thousands_sep_result<char> *
fmt::v10::detail::thousands_sep<char>
          (thousands_sep_result<char> *__return_storage_ptr__,locale_ref loc)

{
  locale_ref loc_00;
  thousands_sep_result<char> result;
  string asStackY_38 [32];
  char in_stack_ffffffffffffffe8;
  undefined7 in_stack_ffffffffffffffe9;
  
  loc_00.locale_._1_7_ = in_stack_ffffffffffffffe9;
  loc_00.locale_._0_1_ = in_stack_ffffffffffffffe8;
  thousands_sep_impl<char>(loc_00);
  std::__cxx11::string::string((string *)__return_storage_ptr__,asStackY_38);
  __return_storage_ptr__->thousands_sep = in_stack_ffffffffffffffe8;
  std::__cxx11::string::~string(asStackY_38);
  return __return_storage_ptr__;
}

Assistant:

inline auto thousands_sep(locale_ref loc) -> thousands_sep_result<Char> {
  auto result = thousands_sep_impl<char>(loc);
  return {result.grouping, Char(result.thousands_sep)};
}